

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_BadServiceName_Test::TestBody
          (FeaturesTest_BadServiceName_Test *this)

{
  string_view expected_errors;
  string_view file_name;
  Metadata MVar1;
  string_view file_text;
  
  MVar1 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar1.descriptor)->file_);
  (this->super_FeaturesTest).super_FeaturesBaseTest.pool_.enforce_naming_style_ = true;
  expected_errors._M_str = "Service name badService should begin with a capital letter";
  expected_errors._M_len = 0x3a;
  file_name._M_str = "naming1.proto";
  file_name._M_len = 0xd;
  file_text._M_str =
       "\n    edition = \"2024\";\n    package naming1;\n    message M {}\n    service badService { rpc GoodMethodName(M) returns (M) {} }\n  "
  ;
  file_text._M_len = 0x7f;
  ValidationErrorTest::ParseAndBuildFileWithErrorSubstr
            ((ValidationErrorTest *)this,file_name,file_text,expected_errors);
  return;
}

Assistant:

TEST_F(FeaturesTest, BadServiceName) {
  BuildDescriptorMessagesInTestPool();

  pool_.EnforceNamingStyle(true);

  ParseAndBuildFileWithErrorSubstr(
      "naming1.proto", R"schema(
    edition = "2024";
    package naming1;
    message M {}
    service badService { rpc GoodMethodName(M) returns (M) {} }
  )schema",
      "Service name badService should begin with a capital letter");
}